

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Functions.cpp
# Opt level: O0

string_view __thiscall RenX::translateName(RenX *this,string_view obj)

{
  string_view object_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  basic_string_view<char,_std::char_traits<char>_> __x_03;
  basic_string_view<char,_std::char_traits<char>_> __x_04;
  basic_string_view<char,_std::char_traits<char>_> __x_05;
  basic_string_view<char,_std::char_traits<char>_> __x_06;
  basic_string_view<char,_std::char_traits<char>_> __x_07;
  basic_string_view<char,_std::char_traits<char>_> __x_08;
  basic_string_view<char,_std::char_traits<char>_> __x_09;
  basic_string_view<char,_std::char_traits<char>_> __x_10;
  basic_string_view<char,_std::char_traits<char>_> __x_11;
  basic_string_view<char,_std::char_traits<char>_> __x_12;
  basic_string_view<char,_std::char_traits<char>_> __x_13;
  basic_string_view<char,_std::char_traits<char>_> __x_14;
  basic_string_view<char,_std::char_traits<char>_> __x_15;
  basic_string_view<char,_std::char_traits<char>_> __x_16;
  basic_string_view<char,_std::char_traits<char>_> __x_17;
  basic_string_view<char,_std::char_traits<char>_> __x_18;
  basic_string_view<char,_std::char_traits<char>_> __x_19;
  basic_string_view<char,_std::char_traits<char>_> __x_20;
  basic_string_view<char,_std::char_traits<char>_> __x_21;
  basic_string_view<char,_std::char_traits<char>_> __x_22;
  basic_string_view<char,_std::char_traits<char>_> __x_23;
  basic_string_view<char,_std::char_traits<char>_> __x_24;
  basic_string_view<char,_std::char_traits<char>_> __x_25;
  basic_string_view<char,_std::char_traits<char>_> __x_26;
  basic_string_view<char,_std::char_traits<char>_> __x_27;
  basic_string_view<char,_std::char_traits<char>_> __x_28;
  basic_string_view<char,_std::char_traits<char>_> __x_29;
  basic_string_view<char,_std::char_traits<char>_> __x_30;
  basic_string_view<char,_std::char_traits<char>_> __x_31;
  basic_string_view<char,_std::char_traits<char>_> __x_32;
  basic_string_view<char,_std::char_traits<char>_> __x_33;
  basic_string_view<char,_std::char_traits<char>_> __x_34;
  basic_string_view<char,_std::char_traits<char>_> __x_35;
  basic_string_view<char,_std::char_traits<char>_> __x_36;
  basic_string_view<char,_std::char_traits<char>_> __x_37;
  basic_string_view<char,_std::char_traits<char>_> __x_38;
  basic_string_view<char,_std::char_traits<char>_> __x_39;
  basic_string_view<char,_std::char_traits<char>_> __x_40;
  basic_string_view<char,_std::char_traits<char>_> __x_41;
  basic_string_view<char,_std::char_traits<char>_> __x_42;
  basic_string_view<char,_std::char_traits<char>_> __x_43;
  basic_string_view<char,_std::char_traits<char>_> __x_44;
  basic_string_view<char,_std::char_traits<char>_> __x_45;
  basic_string_view<char,_std::char_traits<char>_> __x_46;
  basic_string_view<char,_std::char_traits<char>_> __x_47;
  basic_string_view<char,_std::char_traits<char>_> __x_48;
  basic_string_view<char,_std::char_traits<char>_> __x_49;
  basic_string_view<char,_std::char_traits<char>_> __x_50;
  basic_string_view<char,_std::char_traits<char>_> __x_51;
  basic_string_view<char,_std::char_traits<char>_> __x_52;
  basic_string_view<char,_std::char_traits<char>_> __x_53;
  basic_string_view<char,_std::char_traits<char>_> __x_54;
  basic_string_view<char,_std::char_traits<char>_> __x_55;
  basic_string_view<char,_std::char_traits<char>_> __x_56;
  basic_string_view<char,_std::char_traits<char>_> __x_57;
  basic_string_view<char,_std::char_traits<char>_> __x_58;
  basic_string_view<char,_std::char_traits<char>_> __x_59;
  basic_string_view<char,_std::char_traits<char>_> __x_60;
  basic_string_view<char,_std::char_traits<char>_> __x_61;
  basic_string_view<char,_std::char_traits<char>_> __x_62;
  basic_string_view<char,_std::char_traits<char>_> __x_63;
  basic_string_view<char,_std::char_traits<char>_> __x_64;
  basic_string_view<char,_std::char_traits<char>_> __x_65;
  basic_string_view<char,_std::char_traits<char>_> __x_66;
  basic_string_view<char,_std::char_traits<char>_> __x_67;
  basic_string_view<char,_std::char_traits<char>_> __x_68;
  basic_string_view<char,_std::char_traits<char>_> __x_69;
  basic_string_view<char,_std::char_traits<char>_> __x_70;
  basic_string_view<char,_std::char_traits<char>_> __x_71;
  basic_string_view<char,_std::char_traits<char>_> __x_72;
  basic_string_view<char,_std::char_traits<char>_> __x_73;
  basic_string_view<char,_std::char_traits<char>_> __x_74;
  basic_string_view<char,_std::char_traits<char>_> __x_75;
  basic_string_view<char,_std::char_traits<char>_> __x_76;
  basic_string_view<char,_std::char_traits<char>_> __x_77;
  basic_string_view<char,_std::char_traits<char>_> __x_78;
  basic_string_view<char,_std::char_traits<char>_> __x_79;
  basic_string_view<char,_std::char_traits<char>_> __x_80;
  basic_string_view<char,_std::char_traits<char>_> __x_81;
  basic_string_view<char,_std::char_traits<char>_> __x_82;
  basic_string_view<char,_std::char_traits<char>_> __x_83;
  basic_string_view<char,_std::char_traits<char>_> __x_84;
  basic_string_view<char,_std::char_traits<char>_> __x_85;
  basic_string_view<char,_std::char_traits<char>_> __x_86;
  basic_string_view<char,_std::char_traits<char>_> __x_87;
  basic_string_view<char,_std::char_traits<char>_> __x_88;
  basic_string_view<char,_std::char_traits<char>_> __x_89;
  basic_string_view<char,_std::char_traits<char>_> __x_90;
  basic_string_view<char,_std::char_traits<char>_> __x_91;
  basic_string_view<char,_std::char_traits<char>_> __x_92;
  basic_string_view<char,_std::char_traits<char>_> __x_93;
  basic_string_view<char,_std::char_traits<char>_> __x_94;
  basic_string_view<char,_std::char_traits<char>_> __x_95;
  basic_string_view<char,_std::char_traits<char>_> __x_96;
  basic_string_view<char,_std::char_traits<char>_> __x_97;
  basic_string_view<char,_std::char_traits<char>_> __x_98;
  basic_string_view<char,_std::char_traits<char>_> __x_99;
  basic_string_view<char,_std::char_traits<char>_> __x_x00100;
  basic_string_view<char,_std::char_traits<char>_> __x_x00101;
  basic_string_view<char,_std::char_traits<char>_> __x_x00102;
  basic_string_view<char,_std::char_traits<char>_> __x_x00103;
  basic_string_view<char,_std::char_traits<char>_> __x_x00104;
  basic_string_view<char,_std::char_traits<char>_> __x_x00105;
  basic_string_view<char,_std::char_traits<char>_> __x_x00106;
  basic_string_view<char,_std::char_traits<char>_> __x_x00107;
  basic_string_view<char,_std::char_traits<char>_> __x_x00108;
  basic_string_view<char,_std::char_traits<char>_> __x_x00109;
  basic_string_view<char,_std::char_traits<char>_> __x_x00110;
  basic_string_view<char,_std::char_traits<char>_> __x_x00111;
  basic_string_view<char,_std::char_traits<char>_> __x_x00112;
  basic_string_view<char,_std::char_traits<char>_> __x_x00113;
  basic_string_view<char,_std::char_traits<char>_> __x_x00114;
  basic_string_view<char,_std::char_traits<char>_> __x_x00115;
  basic_string_view<char,_std::char_traits<char>_> __x_x00116;
  basic_string_view<char,_std::char_traits<char>_> __x_x00117;
  basic_string_view<char,_std::char_traits<char>_> __x_x00118;
  basic_string_view<char,_std::char_traits<char>_> __x_x00119;
  basic_string_view<char,_std::char_traits<char>_> __x_x00120;
  basic_string_view<char,_std::char_traits<char>_> __x_x00121;
  basic_string_view<char,_std::char_traits<char>_> __x_x00122;
  basic_string_view<char,_std::char_traits<char>_> __x_x00123;
  basic_string_view<char,_std::char_traits<char>_> __x_x00124;
  basic_string_view<char,_std::char_traits<char>_> __x_x00125;
  basic_string_view<char,_std::char_traits<char>_> __x_x00126;
  basic_string_view<char,_std::char_traits<char>_> __x_x00127;
  basic_string_view<char,_std::char_traits<char>_> __x_x00128;
  basic_string_view<char,_std::char_traits<char>_> __x_x00129;
  basic_string_view<char,_std::char_traits<char>_> __x_x00130;
  basic_string_view<char,_std::char_traits<char>_> __x_x00131;
  basic_string_view<char,_std::char_traits<char>_> __x_x00132;
  basic_string_view<char,_std::char_traits<char>_> __x_x00133;
  basic_string_view<char,_std::char_traits<char>_> __x_x00134;
  basic_string_view<char,_std::char_traits<char>_> __x_x00135;
  string_view object_01;
  basic_string_view<char,_std::char_traits<char>_> __x_x00136;
  basic_string_view<char,_std::char_traits<char>_> __x_x00137;
  basic_string_view<char,_std::char_traits<char>_> __x_x00138;
  basic_string_view<char,_std::char_traits<char>_> __x_x00139;
  basic_string_view<char,_std::char_traits<char>_> __x_x00140;
  basic_string_view<char,_std::char_traits<char>_> __x_x00141;
  basic_string_view<char,_std::char_traits<char>_> __x_x00142;
  basic_string_view<char,_std::char_traits<char>_> __x_x00143;
  basic_string_view<char,_std::char_traits<char>_> __x_x00144;
  basic_string_view<char,_std::char_traits<char>_> __x_x00145;
  basic_string_view<char,_std::char_traits<char>_> __x_x00146;
  basic_string_view<char,_std::char_traits<char>_> __x_x00147;
  basic_string_view<char,_std::char_traits<char>_> __x_x00148;
  basic_string_view<char,_std::char_traits<char>_> __x_x00149;
  basic_string_view<char,_std::char_traits<char>_> __x_x00150;
  basic_string_view<char,_std::char_traits<char>_> __x_x00151;
  basic_string_view<char,_std::char_traits<char>_> __x_x00152;
  basic_string_view<char,_std::char_traits<char>_> __x_x00153;
  basic_string_view<char,_std::char_traits<char>_> __x_x00154;
  basic_string_view<char,_std::char_traits<char>_> __x_x00155;
  basic_string_view<char,_std::char_traits<char>_> __x_x00156;
  basic_string_view<char,_std::char_traits<char>_> __x_x00157;
  basic_string_view<char,_std::char_traits<char>_> __x_x00158;
  basic_string_view<char,_std::char_traits<char>_> __x_x00159;
  basic_string_view<char,_std::char_traits<char>_> __x_x00160;
  basic_string_view<char,_std::char_traits<char>_> __x_x00161;
  basic_string_view<char,_std::char_traits<char>_> __x_x00162;
  basic_string_view<char,_std::char_traits<char>_> __x_x00163;
  basic_string_view<char,_std::char_traits<char>_> __x_x00164;
  basic_string_view<char,_std::char_traits<char>_> __x_x00165;
  basic_string_view<char,_std::char_traits<char>_> __x_x00166;
  basic_string_view<char,_std::char_traits<char>_> __x_x00167;
  basic_string_view<char,_std::char_traits<char>_> __x_x00168;
  basic_string_view<char,_std::char_traits<char>_> __x_x00169;
  basic_string_view<char,_std::char_traits<char>_> __x_x00170;
  basic_string_view<char,_std::char_traits<char>_> __x_x00171;
  basic_string_view<char,_std::char_traits<char>_> __x_x00172;
  basic_string_view<char,_std::char_traits<char>_> __x_x00173;
  basic_string_view<char,_std::char_traits<char>_> __x_x00174;
  basic_string_view<char,_std::char_traits<char>_> __x_x00175;
  basic_string_view<char,_std::char_traits<char>_> __x_x00176;
  basic_string_view<char,_std::char_traits<char>_> __x_x00177;
  basic_string_view<char,_std::char_traits<char>_> __x_x00178;
  basic_string_view<char,_std::char_traits<char>_> __x_x00179;
  basic_string_view<char,_std::char_traits<char>_> __x_x00180;
  basic_string_view<char,_std::char_traits<char>_> __x_x00181;
  basic_string_view<char,_std::char_traits<char>_> __x_x00182;
  basic_string_view<char,_std::char_traits<char>_> __x_x00183;
  basic_string_view<char,_std::char_traits<char>_> __x_x00184;
  basic_string_view<char,_std::char_traits<char>_> __x_x00185;
  basic_string_view<char,_std::char_traits<char>_> __x_x00186;
  undefined1 auVar1 [8];
  size_t sVar2;
  char *pcVar3;
  bool bVar4;
  undefined8 uVar5;
  size_type sVar6;
  basic_string_view<char,_std::char_traits<char>_> bVar7;
  undefined1 auVar8 [16];
  string_view sVar9;
  basic_string_view<char,_std::char_traits<char>_> bVar10;
  string_view sVar11;
  undefined1 local_78 [8];
  string_view object;
  undefined8 local_60;
  size_t local_48;
  char *local_40;
  undefined1 local_38 [8];
  string_view iniTranslation;
  string_view obj_local;
  char *local_10;
  
  iniTranslation._M_str = (char *)this;
  bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&iniTranslation._M_str);
  if (bVar4) {
    join_0x00000010_0x00000000_ = sv("",0);
  }
  else {
    getCore();
    uVar5 = Jupiter::Plugin::getConfig();
    bVar7 = sv("Name",4);
    local_48 = bVar7._M_len;
    local_40 = bVar7._M_str;
    uVar5 = Jupiter::Config::operator[](uVar5,local_48,local_40);
    pcVar3 = iniTranslation._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&object._M_str);
    auVar8 = Jupiter::Config::get(uVar5,pcVar3,obj._M_len,object._M_str,local_60);
    iniTranslation._M_len = auVar8._8_8_;
    local_38 = auVar8._0_8_;
    bVar4 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_38);
    if (bVar4) {
      local_78 = (undefined1  [8])iniTranslation._M_str;
      object._M_len = obj._M_len;
      bVar7 = sv("nBab_",5);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0);
      if (sVar6 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_78,5);
      }
      bVar7 = sv("Rx_",3);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0);
      if (sVar6 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_78,3);
      }
      else {
        bVar7 = sv("TS_",3);
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0);
        if (sVar6 == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_78,3);
        }
      }
      bVar7 = sv("Vehicle_",8);
      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0);
      if (sVar6 == 0) {
        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                  ((basic_string_view<char,_std::char_traits<char>_> *)local_78,8);
        sVar2 = object._M_len;
        auVar1 = local_78;
        bVar7 = sv("Harvester_Nod",0xd);
        __x_x00186._M_str = (char *)sVar2;
        __x_x00186._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00186,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Nod Harvester";
          obj_local._M_str = (char *)0xd;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Buggy",5);
        __x_x00185._M_str = (char *)sVar2;
        __x_x00185._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00185,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Buggy";
          obj_local._M_str = (char *)5;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Artillery",9);
        __x_x00184._M_str = (char *)sVar2;
        __x_x00184._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00184,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Mobile Artillery";
          obj_local._M_str = (char *)0x10;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("APC_Nod",7);
        __x_x00183._M_str = (char *)sVar2;
        __x_x00183._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00183,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Nod APC";
          obj_local._M_str = (char *)7;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("LightTank",9);
        __x_x00182._M_str = (char *)sVar2;
        __x_x00182._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00182,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Light Tank";
          obj_local._M_str = (char *)10;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("FlameTank",9);
        __x_x00181._M_str = (char *)sVar2;
        __x_x00181._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00181,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Flame Tank";
          obj_local._M_str = (char *)10;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("StealthTank",0xb);
        __x_x00180._M_str = (char *)sVar2;
        __x_x00180._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00180,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Stealth Tank";
          obj_local._M_str = (char *)0xc;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Chinook_Nod",0xb);
        __x_x00179._M_str = (char *)sVar2;
        __x_x00179._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00179,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Nod Chinook";
          obj_local._M_str = (char *)0xb;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Apache",6);
        __x_x00178._M_str = (char *)sVar2;
        __x_x00178._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00178,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Apache";
          obj_local._M_str = (char *)6;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("ReconBike",9);
        __x_x00177._M_str = (char *)sVar2;
        __x_x00177._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00177,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Recon Bike";
          obj_local._M_str = (char *)10;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("TickTank",8);
        __x_x00176._M_str = (char *)sVar2;
        __x_x00176._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00176,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Tick Tank";
          obj_local._M_str = (char *)9;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Harvester_GDI",0xd);
        __x_x00175._M_str = (char *)sVar2;
        __x_x00175._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00175,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "GDI Harvester";
          obj_local._M_str = (char *)0xd;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Humvee",6);
        __x_x00174._M_str = (char *)sVar2;
        __x_x00174._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00174,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Humvee";
          obj_local._M_str = (char *)6;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("MRLS",4);
        __x_x00173._M_str = (char *)sVar2;
        __x_x00173._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00173,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Mobile Rocket Launcher System";
          obj_local._M_str = (char *)0x1d;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("APC_GDI",7);
        __x_x00172._M_str = (char *)sVar2;
        __x_x00172._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00172,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "GDI APC";
          obj_local._M_str = (char *)7;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("MediumTank",10);
        __x_x00171._M_str = (char *)sVar2;
        __x_x00171._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00171,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Medium Tank";
          obj_local._M_str = (char *)0xb;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("MammothTank",0xb);
        __x_x00170._M_str = (char *)sVar2;
        __x_x00170._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00170,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Mammoth Tank";
          obj_local._M_str = (char *)0xc;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Chinook_GDI",0xb);
        __x_x00169._M_str = (char *)sVar2;
        __x_x00169._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00169,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "GDI Chinook";
          obj_local._M_str = (char *)0xb;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Orca",4);
        __x_x00168._M_str = (char *)sVar2;
        __x_x00168._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00168,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Orca";
          obj_local._M_str = (char *)4;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("HoverMRLS",9);
        __x_x00167._M_str = (char *)sVar2;
        __x_x00167._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00167,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Hover MRLS";
          obj_local._M_str = (char *)10;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Titan",5);
        __x_x00166._M_str = (char *)sVar2;
        __x_x00166._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00166,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Titan";
          obj_local._M_str = (char *)5;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("Wolverine",9);
        __x_x00165._M_str = (char *)sVar2;
        __x_x00165._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00165,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "Wolverine";
          obj_local._M_str = (char *)9;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("A10_DmgType_GattlingGun",0x17);
        __x_x00164._M_str = (char *)sVar2;
        __x_x00164._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00164,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "A10 Thunderbolt Gattling Gun";
          obj_local._M_str = (char *)0x1c;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("A10_DmgType_Bomb",0x10);
        __x_x00163._M_str = (char *)sVar2;
        __x_x00163._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00163,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "A10 Thunderbolt Bomb";
          obj_local._M_str = (char *)0x14;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("AC130_DmgType_HeavyCannon",0x19);
        __x_x00162._M_str = (char *)sVar2;
        __x_x00162._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00162,bVar7);
        sVar2 = object._M_len;
        auVar1 = local_78;
        if (bVar4) {
          local_10 = "AC130 Heavy Cannon";
          obj_local._M_str = (char *)0x12;
          return stack0xffffffffffffffe8;
        }
        bVar7 = sv("AC130_DmgType_AutoCannon",0x18);
        __x_x00161._M_str = (char *)sVar2;
        __x_x00161._M_len = (size_t)auVar1;
        bVar4 = std::operator==(__x_x00161,bVar7);
        if (bVar4) {
          local_10 = "AC130 Auto Cannon";
          obj_local._M_str = (char *)0x11;
          return stack0xffffffffffffffe8;
        }
      }
      else {
        bVar7 = sv("Weapon_",7);
        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0);
        if (sVar6 == 0) {
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_78,7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          bVar7 = sv("HeavyPistol",0xb);
          __x_x00160._M_str = (char *)sVar2;
          __x_x00160._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00160,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Heavy Pistol";
            obj_local._M_str = (char *)0xc;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("Carbine",7);
          __x_x00159._M_str = (char *)sVar2;
          __x_x00159._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00159,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Carbine";
            obj_local._M_str = (char *)7;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("Airstrike_GDI",0xd);
          __x_x00158._M_str = (char *)sVar2;
          __x_x00158._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00158,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "GDI Airstrike";
            obj_local._M_str = (char *)0xd;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("Airstrike_Nod",0xd);
          __x_x00157._M_str = (char *)sVar2;
          __x_x00157._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00157,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Nod Airstrike";
            obj_local._M_str = (char *)0xd;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("TiberiumFlechetteRifle",0x16);
          __x_x00156._M_str = (char *)sVar2;
          __x_x00156._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00156,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Tiberium Flechette Gun";
            obj_local._M_str = (char *)0x16;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("TiberiumAutoRifle",0x11);
          __x_x00155._M_str = (char *)sVar2;
          __x_x00155._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00155,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Tiberium Automatic Rifle";
            obj_local._M_str = (char *)0x18;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("TiberiumAutoRifle_Blue",0x16);
          __x_x00154._M_str = (char *)sVar2;
          __x_x00154._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00154,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Blue Tiberium Automatic Rifle Burst";
            obj_local._M_str = (char *)0x23;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("EMPGrenade",10);
          __x_x00153._M_str = (char *)sVar2;
          __x_x00153._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00153,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "EMP Grenade";
            obj_local._M_str = (char *)0xb;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("SmokeGrenade",0xc);
          __x_x00152._M_str = (char *)sVar2;
          __x_x00152._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00152,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Smoke Grenade";
            obj_local._M_str = (char *)0xd;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("TimedC4",7);
          __x_x00151._M_str = (char *)sVar2;
          __x_x00151._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00151,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Timed C4";
            obj_local._M_str = (char *)8;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("RemoteC4",8);
          __x_x00150._M_str = (char *)sVar2;
          __x_x00150._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00150,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Remote C4";
            obj_local._M_str = (char *)9;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("ProxyC4",7);
          __x_x00149._M_str = (char *)sVar2;
          __x_x00149._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00149,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Proximity C4";
            obj_local._M_str = (char *)0xc;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("ATMine",6);
          __x_x00148._M_str = (char *)sVar2;
          __x_x00148._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00148,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Anti-Tank Mine";
            obj_local._M_str = (char *)0xe;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("IonCannonBeacon",0xf);
          __x_x00147._M_str = (char *)sVar2;
          __x_x00147._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00147,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Ion Cannon Beacon";
            obj_local._M_str = (char *)0x11;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("NukeBeacon",10);
          __x_x00146._M_str = (char *)sVar2;
          __x_x00146._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00146,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Nuclear Missile Beacon";
            obj_local._M_str = (char *)0x16;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("DeployedC4",10);
          __x_x00145._M_str = (char *)sVar2;
          __x_x00145._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00145,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Timed C4";
            obj_local._M_str = (char *)8;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("DeployedTimedC4",0xf);
          __x_x00144._M_str = (char *)sVar2;
          __x_x00144._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00144,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Timed C4";
            obj_local._M_str = (char *)8;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("DeployedRemoteC4",0x10);
          __x_x00143._M_str = (char *)sVar2;
          __x_x00143._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00143,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Remote C4";
            obj_local._M_str = (char *)9;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("DeployedProxyC4",0xf);
          __x_x00142._M_str = (char *)sVar2;
          __x_x00142._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00142,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Proximity C4";
            obj_local._M_str = (char *)0xc;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("DeployedATMine",0xe);
          __x_x00141._M_str = (char *)sVar2;
          __x_x00141._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00141,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Anti-Tank Mine";
            obj_local._M_str = (char *)0xe;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("DeployedIonCannonBeacon",0x17);
          __x_x00140._M_str = (char *)sVar2;
          __x_x00140._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00140,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Ion Cannon Beacon";
            obj_local._M_str = (char *)0x11;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("DeployedNukeBeacon",0x12);
          __x_x00139._M_str = (char *)sVar2;
          __x_x00139._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00139,bVar7);
          sVar2 = object._M_len;
          auVar1 = local_78;
          if (bVar4) {
            local_10 = "Nuclear Missile Beacon";
            obj_local._M_str = (char *)0x16;
            return stack0xffffffffffffffe8;
          }
          bVar7 = sv("CrateNuke",9);
          __x_x00138._M_str = (char *)sVar2;
          __x_x00138._M_len = (size_t)auVar1;
          bVar4 = std::operator==(__x_x00138,bVar7);
          if (bVar4) {
            local_10 = "Nuclear Crate Explosion";
            obj_local._M_str = (char *)0x17;
            return stack0xffffffffffffffe8;
          }
        }
        else {
          bVar7 = sv("Projectile_",0xb);
          sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0);
          if (sVar6 == 0) {
            std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_78,0xb);
            sVar2 = object._M_len;
            auVar1 = local_78;
            bVar7 = sv("EMPGrenade",10);
            __x_x00137._M_str = (char *)sVar2;
            __x_x00137._M_len = (size_t)auVar1;
            bVar4 = std::operator==(__x_x00137,bVar7);
            sVar2 = object._M_len;
            auVar1 = local_78;
            if (bVar4) {
              local_10 = "EMP Grenade";
              obj_local._M_str = (char *)0xb;
              return stack0xffffffffffffffe8;
            }
            bVar7 = sv("SmokeGrenade",0xc);
            __x_x00136._M_str = (char *)sVar2;
            __x_x00136._M_len = (size_t)auVar1;
            bVar4 = std::operator==(__x_x00136,bVar7);
            if (bVar4) {
              local_10 = "Smoke Grenade";
              obj_local._M_str = (char *)0xd;
              return stack0xffffffffffffffe8;
            }
          }
          else {
            bVar7 = sv("InventoryManager_",0x11);
            sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0)
            ;
            if (sVar6 == 0) {
              std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78,0x11);
              sVar9._M_str = (char *)object._M_len;
              sVar9._M_len = (size_t)local_78;
              sVar9 = translateCharacter(sVar9);
              return sVar9;
            }
            bVar7 = sv("FamilyInfo_",0xb);
            sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0)
            ;
            if (sVar6 == 0) {
              std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78,0xb);
              object_01._M_str = (char *)object._M_len;
              object_01._M_len = (size_t)local_78;
              sVar9 = translateCharacter(object_01);
              return sVar9;
            }
            bVar7 = sv("DmgType_",8);
            sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,0)
            ;
            if (sVar6 == 0) {
              std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_78,8);
              sVar2 = object._M_len;
              auVar1 = local_78;
              bVar7 = sv("Suicided",8);
              __x_x00135._M_str = (char *)sVar2;
              __x_x00135._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00135,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Suicide";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Fell",4);
              __x_x00134._M_str = (char *)sVar2;
              __x_x00134._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00134,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Fall";
                obj_local._M_str = (char *)4;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Tiberium",8);
              __x_x00133._M_str = (char *)sVar2;
              __x_x00133._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00133,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Tiberium";
                obj_local._M_str = (char *)8;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("TiberiumBleed",0xd);
              __x_x00132._M_str = (char *)sVar2;
              __x_x00132._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00132,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Tiberium Decay";
                obj_local._M_str = (char *)0xe;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("TiberiumBleed_Blue",0x12);
              __x_x00131._M_str = (char *)sVar2;
              __x_x00131._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00131,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Blue Tiberium Decay";
                obj_local._M_str = (char *)0x13;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("RanOver",7);
              __x_x00130._M_str = (char *)sVar2;
              __x_x00130._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00130,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Crushed";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Pistol",6);
              __x_x00129._M_str = (char *)sVar2;
              __x_x00129._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00129,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Pistol";
                obj_local._M_str = (char *)6;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("SMG",3);
              __x_x00128._M_str = (char *)sVar2;
              __x_x00128._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00128,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Machine Pistol";
                obj_local._M_str = (char *)0xe;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("HeavyPistol",0xb);
              __x_x00127._M_str = (char *)sVar2;
              __x_x00127._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00127,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Heavy Pistol";
                obj_local._M_str = (char *)0xc;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Carbine",7);
              __x_x00126._M_str = (char *)sVar2;
              __x_x00126._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00126,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Carbine";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("TiberiumFlechetteRifle",0x16);
              __x_x00125._M_str = (char *)sVar2;
              __x_x00125._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00125,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Tiberium Flechette Gun";
                obj_local._M_str = (char *)0x16;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("TiberiumAutoRifle",0x11);
              __x_x00124._M_str = (char *)sVar2;
              __x_x00124._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00124,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Tiberium Automatic Rifle";
                obj_local._M_str = (char *)0x18;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("TiberiumAutoRifle_Blue",0x16);
              __x_x00123._M_str = (char *)sVar2;
              __x_x00123._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00123,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Blue Tiberium Automatic Rifle Burst";
                obj_local._M_str = (char *)0x23;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("TiberiumAutoRifle_Flechette_Blue",0x20);
              __x_x00122._M_str = (char *)sVar2;
              __x_x00122._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00122,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Blue Tiberium Automatic Rifle";
                obj_local._M_str = (char *)0x1d;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Grenade",7);
              __x_x00121._M_str = (char *)sVar2;
              __x_x00121._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00121,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Grenade";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("TimedC4",7);
              __x_x00120._M_str = (char *)sVar2;
              __x_x00120._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00120,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Timed C4";
                obj_local._M_str = (char *)8;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("RemoteC4",8);
              __x_x00119._M_str = (char *)sVar2;
              __x_x00119._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00119,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Remote C4";
                obj_local._M_str = (char *)9;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("ProxyC4",7);
              __x_x00118._M_str = (char *)sVar2;
              __x_x00118._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00118,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Proximity C4";
                obj_local._M_str = (char *)0xc;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("ATMine",6);
              __x_x00117._M_str = (char *)sVar2;
              __x_x00117._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00117,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Anti-Tank Mine";
                obj_local._M_str = (char *)0xe;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("EMPGrenade",10);
              __x_x00116._M_str = (char *)sVar2;
              __x_x00116._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00116,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "EMP Grenade";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("BurnC4",6);
              __x_x00115._M_str = (char *)sVar2;
              __x_x00115._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00115,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "C4 Burn";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("FireBleed",9);
              __x_x00114._M_str = (char *)sVar2;
              __x_x00114._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00114,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Fire Burn";
                obj_local._M_str = (char *)9;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("AutoRifle",9);
              __x_x00113._M_str = (char *)sVar2;
              __x_x00113._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00113,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Automatic Rifle";
                obj_local._M_str = (char *)0xf;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Shotgun",7);
              __x_x00112._M_str = (char *)sVar2;
              __x_x00112._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00112,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Shotgun";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("FlameThrower",0xc);
              __x_x00111._M_str = (char *)sVar2;
              __x_x00111._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00111,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Flamethrower";
                obj_local._M_str = (char *)0xc;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("GrenadeLauncher",0xf);
              __x_x00110._M_str = (char *)sVar2;
              __x_x00110._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00110,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Grenade Launcher";
                obj_local._M_str = (char *)0x10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("MarksmanRifle",0xd);
              __x_x00109._M_str = (char *)sVar2;
              __x_x00109._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00109,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Marksman\'s Rifle";
                obj_local._M_str = (char *)0x10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("ChainGun",8);
              __x_x00108._M_str = (char *)sVar2;
              __x_x00108._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00108,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Chain Gun";
                obj_local._M_str = (char *)9;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("MissileLauncher",0xf);
              __x_x00107._M_str = (char *)sVar2;
              __x_x00107._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00107,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Missile Launcher";
                obj_local._M_str = (char *)0x10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("MissileLauncher_Alt",0x13);
              __x_x00106._M_str = (char *)sVar2;
              __x_x00106._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00106,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Missile Launcher";
                obj_local._M_str = (char *)0x10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("ChemicalThrower",0xf);
              __x_x00105._M_str = (char *)sVar2;
              __x_x00105._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00105,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Chemical Spray Gun";
                obj_local._M_str = (char *)0x12;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("LaserRifle",10);
              __x_x00104._M_str = (char *)sVar2;
              __x_x00104._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00104,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Laser Rifle";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("TacticalRifle",0xd);
              __x_x00103._M_str = (char *)sVar2;
              __x_x00103._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00103,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Tactical Rifle";
                obj_local._M_str = (char *)0xe;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("RocketLauncher",0xe);
              __x_x00102._M_str = (char *)sVar2;
              __x_x00102._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00102,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Rocket Launcher";
                obj_local._M_str = (char *)0xf;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("LaserChainGun",0xd);
              __x_x00101._M_str = (char *)sVar2;
              __x_x00101._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00101,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Laser Chain Gun";
                obj_local._M_str = (char *)0xf;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("FlakCannon",10);
              __x_x00100._M_str = (char *)sVar2;
              __x_x00100._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_x00100,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Flak";
                obj_local._M_str = (char *)4;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("FlakCannon_Alt",0xe);
              __x_99._M_str = (char *)sVar2;
              __x_99._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_99,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Concentrated Flak";
                obj_local._M_str = (char *)0x11;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("SniperRifle",0xb);
              __x_98._M_str = (char *)sVar2;
              __x_98._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_98,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Sniper Rifle";
                obj_local._M_str = (char *)0xc;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("RamjetRifle",0xb);
              __x_97._M_str = (char *)sVar2;
              __x_97._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_97,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Ramjet";
                obj_local._M_str = (char *)6;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Railgun",7);
              __x_96._M_str = (char *)sVar2;
              __x_96._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_96,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Railgun";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("PersonalIonCannon",0x11);
              __x_95._M_str = (char *)sVar2;
              __x_95._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_95,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Personal Ion Cannon";
                obj_local._M_str = (char *)0x13;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("VoltRifle",9);
              __x_94._M_str = (char *)sVar2;
              __x_94._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_94,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Volt Rifle";
                obj_local._M_str = (char *)10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("VoltRifle_Alt",0xd);
              __x_93._M_str = (char *)sVar2;
              __x_93._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_93,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Volt Rifle Burst";
                obj_local._M_str = (char *)0x10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("VoltAutoRifle",0xd);
              __x_92._M_str = (char *)sVar2;
              __x_92._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_92,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Volt Automatic Rifle";
                obj_local._M_str = (char *)0x14;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("VoltAutoRifle_Alt",0x11);
              __x_91._M_str = (char *)sVar2;
              __x_91._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_91,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Volt Automatic Rifle Burst";
                obj_local._M_str = (char *)0x1a;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("MammothTank_Missile",0x13);
              __x_90._M_str = (char *)sVar2;
              __x_90._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_90,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Mammoth Tank Missile";
                obj_local._M_str = (char *)0x14;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("MammothTank_Cannon",0x12);
              __x_89._M_str = (char *)sVar2;
              __x_89._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_89,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Mammoth Tank Cannon";
                obj_local._M_str = (char *)0x13;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Orca_Missile",0xc);
              __x_88._M_str = (char *)sVar2;
              __x_88._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_88,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Orca Missile";
                obj_local._M_str = (char *)0xc;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Orca_Gun",8);
              __x_87._M_str = (char *)sVar2;
              __x_87._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_87,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Orca Gun";
                obj_local._M_str = (char *)8;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Orca_Passenger",0xe);
              __x_86._M_str = (char *)sVar2;
              __x_86._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_86,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Orca Passenger Missile";
                obj_local._M_str = (char *)0x16;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Apache_Rocket",0xd);
              __x_85._M_str = (char *)sVar2;
              __x_85._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_85,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Apache Rocket";
                obj_local._M_str = (char *)0xd;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Apache_Gun",10);
              __x_84._M_str = (char *)sVar2;
              __x_84._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_84,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Apache Gun";
                obj_local._M_str = (char *)10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Apache_Passenger",0x10);
              __x_83._M_str = (char *)sVar2;
              __x_83._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_83,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Apache Passenger Missile";
                obj_local._M_str = (char *)0x18;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("AGT_MG",6);
              __x_82._M_str = (char *)sVar2;
              __x_82._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_82,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Machine Gun";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("AGT_Rocket",10);
              __x_81._M_str = (char *)sVar2;
              __x_81._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_81,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Rocket";
                obj_local._M_str = (char *)6;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Obelisk",7);
              __x_80._M_str = (char *)sVar2;
              __x_80._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_80,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Obelisk Laser";
                obj_local._M_str = (char *)0xd;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("AGT_MG",6);
              __x_79._M_str = (char *)sVar2;
              __x_79._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_79,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Machine Gun";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("AGT_Rocket",10);
              __x_78._M_str = (char *)sVar2;
              __x_78._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_78,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Rocket";
                obj_local._M_str = (char *)6;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Obelisk",7);
              __x_77._M_str = (char *)sVar2;
              __x_77._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_77,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Obelisk Laser";
                obj_local._M_str = (char *)0xd;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("GuardTower",10);
              __x_76._M_str = (char *)sVar2;
              __x_76._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_76,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Guard Tower";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Turret",6);
              __x_75._M_str = (char *)sVar2;
              __x_75._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_75,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Turret";
                obj_local._M_str = (char *)6;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("SAMSite",7);
              __x_74._M_str = (char *)sVar2;
              __x_74._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_74,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "SAM Site";
                obj_local._M_str = (char *)8;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("AATower",7);
              __x_73._M_str = (char *)sVar2;
              __x_73._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_73,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Anti-Air Guard Tower";
                obj_local._M_str = (char *)0x14;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("GunEmpl",7);
              __x_72._M_str = (char *)sVar2;
              __x_72._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_72,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Gun Emplacement Gattling Gun";
                obj_local._M_str = (char *)0x1c;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("GunEmpl_Alt",0xb);
              __x_71._M_str = (char *)sVar2;
              __x_71._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_71,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Gun Emplacement Automatic Cannon";
                obj_local._M_str = (char *)0x20;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("RocketEmpl_Swarm",0x10);
              __x_70._M_str = (char *)sVar2;
              __x_70._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_70,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Rocket Emplacement Swarm Missile";
                obj_local._M_str = (char *)0x20;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("RocketEmpl_Missile",0x12);
              __x_69._M_str = (char *)sVar2;
              __x_69._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_69,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Rocket Emplacement Hellfire Missile";
                obj_local._M_str = (char *)0x23;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Nuke",4);
              __x_68._M_str = (char *)sVar2;
              __x_68._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_68,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Nuclear Missile Strike";
                obj_local._M_str = (char *)0x16;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("IonCannon",9);
              __x_67._M_str = (char *)sVar2;
              __x_67._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_67,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Ion Cannon Strike";
                obj_local._M_str = (char *)0x11;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Harvester_Nod",0xd);
              __x_66._M_str = (char *)sVar2;
              __x_66._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_66,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Nod Harvester";
                obj_local._M_str = (char *)0xd;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Buggy",5);
              __x_65._M_str = (char *)sVar2;
              __x_65._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_65,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Buggy";
                obj_local._M_str = (char *)5;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Artillery",9);
              __x_64._M_str = (char *)sVar2;
              __x_64._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_64,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Mobile Artillery";
                obj_local._M_str = (char *)0x10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("APC_Nod",7);
              __x_63._M_str = (char *)sVar2;
              __x_63._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_63,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Nod APC";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("LightTank",9);
              __x_62._M_str = (char *)sVar2;
              __x_62._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_62,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Light Tank";
                obj_local._M_str = (char *)10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("FlameTank",9);
              __x_61._M_str = (char *)sVar2;
              __x_61._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_61,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Flame Tank";
                obj_local._M_str = (char *)10;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("StealthTank",0xb);
              __x_60._M_str = (char *)sVar2;
              __x_60._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_60,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Stealth Tank";
                obj_local._M_str = (char *)0xc;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Chinook_Nod",0xb);
              __x_59._M_str = (char *)sVar2;
              __x_59._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_59,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Nod Chinook";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Apache",6);
              __x_58._M_str = (char *)sVar2;
              __x_58._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_58,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Apache";
                obj_local._M_str = (char *)6;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Harvester_GDI",0xd);
              __x_57._M_str = (char *)sVar2;
              __x_57._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_57,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "GDI Harvester";
                obj_local._M_str = (char *)0xd;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Humvee",6);
              __x_56._M_str = (char *)sVar2;
              __x_56._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_56,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Humvee";
                obj_local._M_str = (char *)6;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("MRLS",4);
              __x_55._M_str = (char *)sVar2;
              __x_55._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_55,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Mobile Rocket Launcher System";
                obj_local._M_str = (char *)0x1d;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("APC_GDI",7);
              __x_54._M_str = (char *)sVar2;
              __x_54._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_54,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "GDI APC";
                obj_local._M_str = (char *)7;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("MediumTank",10);
              __x_53._M_str = (char *)sVar2;
              __x_53._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_53,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Medium Tank";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("MammothTank",0xb);
              __x_52._M_str = (char *)sVar2;
              __x_52._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_52,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Mammoth Tank";
                obj_local._M_str = (char *)0xc;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Chinook_GDI",0xb);
              __x_51._M_str = (char *)sVar2;
              __x_51._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_51,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "GDI Chinook";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("Orca",4);
              __x_50._M_str = (char *)sVar2;
              __x_50._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_50,bVar7);
              sVar2 = object._M_len;
              auVar1 = local_78;
              if (bVar4) {
                local_10 = "Orca";
                obj_local._M_str = (char *)4;
                return stack0xffffffffffffffe8;
              }
              bVar7 = sv("A10_Missile",0xb);
              __x_49._M_str = (char *)sVar2;
              __x_49._M_len = (size_t)auVar1;
              bVar4 = std::operator==(__x_49,bVar7);
              if (bVar4) {
                local_10 = "A10 Missile";
                obj_local._M_str = (char *)0xb;
                return stack0xffffffffffffffe8;
              }
            }
            else {
              bVar7 = sv("Building_",9);
              sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_78,bVar7,
                                 0);
              if (sVar6 == 0) {
                std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_78,9);
                sVar2 = object._M_len;
                auVar1 = local_78;
                bVar7 = sv("HandOfNod",9);
                __x_48._M_str = (char *)sVar2;
                __x_48._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_48,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Hand of Nod";
                  obj_local._M_str = (char *)0xb;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("AirTower",8);
                __x_47._M_str = (char *)sVar2;
                __x_47._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_47,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Airstrip";
                  obj_local._M_str = (char *)8;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Airstrip",8);
                __x_46._M_str = (char *)sVar2;
                __x_46._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_46,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Airstrip";
                  obj_local._M_str = (char *)8;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Refinery_Nod",0xc);
                __x_45._M_str = (char *)sVar2;
                __x_45._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_45,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Nod Refinery";
                  obj_local._M_str = (char *)0xc;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("PowerPlant_Nod",0xe);
                __x_44._M_str = (char *)sVar2;
                __x_44._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_44,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Nod Power Plant";
                  obj_local._M_str = (char *)0xf;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("HandOfNod_Internals",0x13);
                __x_43._M_str = (char *)sVar2;
                __x_43._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_43,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Hand of Nod";
                  obj_local._M_str = (char *)0xb;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("AirTower_Internals",0x12);
                __x_42._M_str = (char *)sVar2;
                __x_42._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_42,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Airstrip";
                  obj_local._M_str = (char *)8;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Airstrip_Internals",0x12);
                __x_41._M_str = (char *)sVar2;
                __x_41._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_41,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Airstrip";
                  obj_local._M_str = (char *)8;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Refinery_Nod_Internals",0x16);
                __x_40._M_str = (char *)sVar2;
                __x_40._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_40,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Nod Refinery";
                  obj_local._M_str = (char *)0xc;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("PowerPlant_Nod_Internals",0x18);
                __x_39._M_str = (char *)sVar2;
                __x_39._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_39,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Nod Power Plant";
                  obj_local._M_str = (char *)0xf;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Barracks",8);
                __x_38._M_str = (char *)sVar2;
                __x_38._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_38,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Barracks";
                  obj_local._M_str = (char *)8;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("WeaponsFactory",0xe);
                __x_37._M_str = (char *)sVar2;
                __x_37._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_37,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Weapons Factory";
                  obj_local._M_str = (char *)0xf;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Refinery_GDI",0xc);
                __x_36._M_str = (char *)sVar2;
                __x_36._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_36,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "GDI Refinery";
                  obj_local._M_str = (char *)0xc;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("PowerPlant_GDI",0xe);
                __x_35._M_str = (char *)sVar2;
                __x_35._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_35,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "GDI Power Plant";
                  obj_local._M_str = (char *)0xf;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Barracks_Internals",0x12);
                __x_34._M_str = (char *)sVar2;
                __x_34._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_34,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Barracks";
                  obj_local._M_str = (char *)8;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("WeaponsFactory_Internals",0x18);
                __x_33._M_str = (char *)sVar2;
                __x_33._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_33,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Weapons Factory";
                  obj_local._M_str = (char *)0xf;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Refinery_GDI_Internals",0x16);
                __x_32._M_str = (char *)sVar2;
                __x_32._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_32,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "GDI Refinery";
                  obj_local._M_str = (char *)0xc;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("PowerPlant_GDI_Internals",0x18);
                __x_31._M_str = (char *)sVar2;
                __x_31._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_31,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "GDI Power Plant";
                  obj_local._M_str = (char *)0xf;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("AdvancedGuardTower",0x12);
                __x_30._M_str = (char *)sVar2;
                __x_30._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_30,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Advanced Guard Tower";
                  obj_local._M_str = (char *)0x14;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Obelisk",7);
                __x_29._M_str = (char *)sVar2;
                __x_29._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_29,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Obelisk of Light";
                  obj_local._M_str = (char *)0x10;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("AdvancedGuardTower_Internals",0x1c);
                __x_28._M_str = (char *)sVar2;
                __x_28._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_28,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Advanced Guard Tower";
                  obj_local._M_str = (char *)0x14;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Obelisk_Internals",0x11);
                __x_27._M_str = (char *)sVar2;
                __x_27._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_27,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Obelisk of Light";
                  obj_local._M_str = (char *)0x10;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Silo",4);
                __x_26._M_str = (char *)sVar2;
                __x_26._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_26,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Tiberium Silo";
                  obj_local._M_str = (char *)0xd;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("CommCentre",10);
                __x_25._M_str = (char *)sVar2;
                __x_25._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_25,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Communications Center";
                  obj_local._M_str = (char *)0x15;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("Silo_Internals",0xe);
                __x_24._M_str = (char *)sVar2;
                __x_24._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_24,bVar7);
                sVar2 = object._M_len;
                auVar1 = local_78;
                if (bVar4) {
                  local_10 = "Tiberium Silo";
                  obj_local._M_str = (char *)0xd;
                  return stack0xffffffffffffffe8;
                }
                bVar7 = sv("CommCentre_Internals",0x14);
                __x_23._M_str = (char *)sVar2;
                __x_23._M_len = (size_t)auVar1;
                bVar4 = std::operator==(__x_23,bVar7);
                if (bVar4) {
                  local_10 = "Communications Center";
                  obj_local._M_str = (char *)0x15;
                  return stack0xffffffffffffffe8;
                }
              }
              else {
                bVar7 = sv("CapturableMCT_",0xe);
                sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_78,
                                   bVar7,0);
                if (sVar6 == 0) {
                  std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_78,0xe);
                  sVar2 = object._M_len;
                  auVar1 = local_78;
                  bVar7 = sv("Fort",4);
                  __x_22._M_str = (char *)sVar2;
                  __x_22._M_len = (size_t)auVar1;
                  bVar4 = std::operator==(__x_22,bVar7);
                  sVar2 = object._M_len;
                  auVar1 = local_78;
                  if (bVar4) {
                    local_10 = "Fort";
                    obj_local._M_str = (char *)4;
                    return stack0xffffffffffffffe8;
                  }
                  bVar7 = sv("MC",2);
                  __x_21._M_str = (char *)sVar2;
                  __x_21._M_len = (size_t)auVar1;
                  bVar4 = std::operator==(__x_21,bVar7);
                  sVar2 = object._M_len;
                  auVar1 = local_78;
                  if (bVar4) {
                    local_10 = "Medical Center";
                    obj_local._M_str = (char *)0xe;
                    return stack0xffffffffffffffe8;
                  }
                  bVar7 = sv("Fort_Internals",0xe);
                  __x_20._M_str = (char *)sVar2;
                  __x_20._M_len = (size_t)auVar1;
                  bVar4 = std::operator==(__x_20,bVar7);
                  sVar2 = object._M_len;
                  auVar1 = local_78;
                  if (bVar4) {
                    local_10 = "Fort";
                    obj_local._M_str = (char *)4;
                    return stack0xffffffffffffffe8;
                  }
                  bVar7 = sv("MC_Internals",0xc);
                  __x_19._M_str = (char *)sVar2;
                  __x_19._M_len = (size_t)auVar1;
                  bVar4 = std::operator==(__x_19,bVar7);
                  if (bVar4) {
                    local_10 = "Medical Center";
                    obj_local._M_str = (char *)0xe;
                    return stack0xffffffffffffffe8;
                  }
                }
                else {
                  bVar7 = sv("Defence_",8);
                  sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_78,
                                     bVar7,0);
                  if (sVar6 == 0) {
                    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                              ((basic_string_view<char,_std::char_traits<char>_> *)local_78,8);
                    sVar2 = object._M_len;
                    auVar1 = local_78;
                    bVar7 = sv("GuardTower",10);
                    __x_18._M_str = (char *)sVar2;
                    __x_18._M_len = (size_t)auVar1;
                    bVar4 = std::operator==(__x_18,bVar7);
                    sVar2 = object._M_len;
                    auVar1 = local_78;
                    if (bVar4) {
                      local_10 = "Guard Tower";
                      obj_local._M_str = (char *)0xb;
                      return stack0xffffffffffffffe8;
                    }
                    bVar7 = sv("Turret",6);
                    __x_17._M_str = (char *)sVar2;
                    __x_17._M_len = (size_t)auVar1;
                    bVar4 = std::operator==(__x_17,bVar7);
                    sVar2 = object._M_len;
                    auVar1 = local_78;
                    if (bVar4) {
                      local_10 = "Turret";
                      obj_local._M_str = (char *)6;
                      return stack0xffffffffffffffe8;
                    }
                    bVar7 = sv("SAMSite",7);
                    __x_16._M_str = (char *)sVar2;
                    __x_16._M_len = (size_t)auVar1;
                    bVar4 = std::operator==(__x_16,bVar7);
                    sVar2 = object._M_len;
                    auVar1 = local_78;
                    if (bVar4) {
                      local_10 = "SAM Site";
                      obj_local._M_str = (char *)8;
                      return stack0xffffffffffffffe8;
                    }
                    bVar7 = sv("AATower",7);
                    __x_15._M_str = (char *)sVar2;
                    __x_15._M_len = (size_t)auVar1;
                    bVar4 = std::operator==(__x_15,bVar7);
                    sVar2 = object._M_len;
                    auVar1 = local_78;
                    if (bVar4) {
                      local_10 = "Anti-Air Guard Tower";
                      obj_local._M_str = (char *)0x14;
                      return stack0xffffffffffffffe8;
                    }
                    bVar7 = sv("GunEmplacement",0xe);
                    __x_14._M_str = (char *)sVar2;
                    __x_14._M_len = (size_t)auVar1;
                    bVar4 = std::operator==(__x_14,bVar7);
                    sVar2 = object._M_len;
                    auVar1 = local_78;
                    if (bVar4) {
                      local_10 = "Gun Emplacement";
                      obj_local._M_str = (char *)0xf;
                      return stack0xffffffffffffffe8;
                    }
                    bVar7 = sv("RocketEmplacement",0x11);
                    __x_13._M_str = (char *)sVar2;
                    __x_13._M_len = (size_t)auVar1;
                    bVar4 = std::operator==(__x_13,bVar7);
                    if (bVar4) {
                      local_10 = "Rocket Emplacement";
                      obj_local._M_str = (char *)0x12;
                      return stack0xffffffffffffffe8;
                    }
                  }
                  else {
                    bVar7 = sv("Sentinel_",9);
                    sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                      ((basic_string_view<char,_std::char_traits<char>_> *)local_78,
                                       bVar7,0);
                    if (sVar6 == 0) {
                      std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                                ((basic_string_view<char,_std::char_traits<char>_> *)local_78,9);
                      sVar2 = object._M_len;
                      auVar1 = local_78;
                      bVar7 = sv("AGT_MG_Base",0xb);
                      __x_12._M_str = (char *)sVar2;
                      __x_12._M_len = (size_t)auVar1;
                      bVar4 = std::operator==(__x_12,bVar7);
                      sVar2 = object._M_len;
                      auVar1 = local_78;
                      if (bVar4) {
                        local_10 = "Advanced Guard Tower";
                        obj_local._M_str = (char *)0x14;
                        return stack0xffffffffffffffe8;
                      }
                      bVar7 = sv("AGT_Rockets_Base",0x10);
                      __x_11._M_str = (char *)sVar2;
                      __x_11._M_len = (size_t)auVar1;
                      bVar4 = std::operator==(__x_11,bVar7);
                      sVar2 = object._M_len;
                      auVar1 = local_78;
                      if (bVar4) {
                        local_10 = "Advanced Guard Tower";
                        obj_local._M_str = (char *)0x14;
                        return stack0xffffffffffffffe8;
                      }
                      bVar7 = sv("Obelisk_Laser_Base",0x12);
                      __x_10._M_str = (char *)sVar2;
                      __x_10._M_len = (size_t)auVar1;
                      bVar4 = std::operator==(__x_10,bVar7);
                      if (bVar4) {
                        local_10 = "Obelisk of Light";
                        obj_local._M_str = (char *)0x10;
                        return stack0xffffffffffffffe8;
                      }
                    }
                    else {
                      bVar7 = sv("UTDmgType_",10);
                      sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                        ((basic_string_view<char,_std::char_traits<char>_> *)
                                         local_78,bVar7,0);
                      if (sVar6 == 0) {
                        std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_78,10);
                        sVar2 = object._M_len;
                        auVar1 = local_78;
                        bVar7 = sv("VehicleExplosion",0x10);
                        __x_09._M_str = (char *)sVar2;
                        __x_09._M_len = (size_t)auVar1;
                        bVar4 = std::operator==(__x_09,bVar7);
                        sVar2 = object._M_len;
                        auVar1 = local_78;
                        if (bVar4) {
                          local_10 = "Vehicle Explosion";
                          obj_local._M_str = (char *)0x11;
                          return stack0xffffffffffffffe8;
                        }
                        bVar7 = sv("Drowned",7);
                        __x_08._M_str = (char *)sVar2;
                        __x_08._M_len = (size_t)auVar1;
                        bVar4 = std::operator==(__x_08,bVar7);
                        if (bVar4) {
                          local_10 = "Drowned";
                          obj_local._M_str = (char *)7;
                          return stack0xffffffffffffffe8;
                        }
                      }
                      else {
                        bVar7 = sv("VoteMenuChoice_",0xf);
                        sVar6 = std::basic_string_view<char,_std::char_traits<char>_>::find
                                          ((basic_string_view<char,_std::char_traits<char>_> *)
                                           local_78,bVar7,0);
                        sVar2 = object._M_len;
                        auVar1 = local_78;
                        if (sVar6 == 0) {
                          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                                    ((basic_string_view<char,_std::char_traits<char>_> *)local_78,
                                     0xf);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          bVar7 = sv("AddBots",7);
                          __x_07._M_str = (char *)sVar2;
                          __x_07._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x_07,bVar7);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Add Bots";
                            obj_local._M_str = (char *)8;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("ChangeMap",9);
                          __x_06._M_str = (char *)sVar2;
                          __x_06._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x_06,bVar7);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Change Map";
                            obj_local._M_str = (char *)10;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("Donate",6);
                          __x_05._M_str = (char *)sVar2;
                          __x_05._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x_05,bVar7);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Donate";
                            obj_local._M_str = (char *)6;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("Kick",4);
                          __x_04._M_str = (char *)sVar2;
                          __x_04._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x_04,bVar7);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Kick";
                            obj_local._M_str = (char *)4;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("RemoveBots",10);
                          __x_03._M_str = (char *)sVar2;
                          __x_03._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x_03,bVar7);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Remove Bots";
                            obj_local._M_str = (char *)0xb;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("RestartMatch",0xc);
                          __x_02._M_str = (char *)sVar2;
                          __x_02._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x_02,bVar7);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Restart Match";
                            obj_local._M_str = (char *)0xd;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("StartMatch",10);
                          __x_01._M_str = (char *)sVar2;
                          __x_01._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x_01,bVar7);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Start Match";
                            obj_local._M_str = (char *)0xb;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("Survey",6);
                          __x_00._M_str = (char *)sVar2;
                          __x_00._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x_00,bVar7);
                          if (bVar4) {
                            local_10 = "Survey";
                            obj_local._M_str = (char *)6;
                            return stack0xffffffffffffffe8;
                          }
                        }
                        else {
                          bVar10 = sv("IonCannonBeacon",0xf);
                          bVar7._M_str = (char *)sVar2;
                          bVar7._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(bVar7,bVar10);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Ion Cannon Beacon";
                            obj_local._M_str = (char *)0x11;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("NukeBeacon",10);
                          bVar10._M_str = (char *)sVar2;
                          bVar10._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(bVar10,bVar7);
                          sVar2 = object._M_len;
                          auVar1 = local_78;
                          if (bVar4) {
                            local_10 = "Nuclear Strike Beacon";
                            obj_local._M_str = (char *)0x15;
                            return stack0xffffffffffffffe8;
                          }
                          bVar7 = sv("KillZDamageType",0xf);
                          __x._M_str = (char *)sVar2;
                          __x._M_len = (size_t)auVar1;
                          bVar4 = std::operator==(__x,bVar7);
                          if (bVar4) {
                            local_10 = "Kill Zone";
                            obj_local._M_str = (char *)9;
                            return stack0xffffffffffffffe8;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      object_00._M_str = (char *)object._M_len;
      object_00._M_len = (size_t)local_78;
      join_0x00000010_0x00000000_ = translateCharacter(object_00);
    }
    else {
      local_10 = (char *)iniTranslation._M_len;
      obj_local._M_str = (char *)local_38;
    }
  }
  sVar11._M_len = (size_t)obj_local._M_str;
  sVar11._M_str = local_10;
  return sVar11;
}

Assistant:

std::string_view RenX::translateName(std::string_view obj) {
	if (obj.empty())
		return ""sv;

	std::string_view iniTranslation = RenX::getCore()->getConfig()["Name"sv].get(obj);
	if (!iniTranslation.empty())
		return iniTranslation;

	std::string_view object = obj;

	if (object.find("nBab_"sv) == 0)
		object.remove_prefix(5);
	
	if (object.find("Rx_"sv) == 0)
		object.remove_prefix(3);
	else if (object.find("TS_"sv) == 0)
		object.remove_prefix(3);

	if (object.find("Vehicle_"sv) == 0)
	{
		object.remove_prefix(8);

		/** Nod Vehicles */
		if (object == "Harvester_Nod"sv) return translated_Vehicle_Harvester_Nod;
		if (object == "Buggy"sv) return translated_Vehicle_Buggy;
		if (object == "Artillery"sv) return translated_Vehicle_Artillery;
		if (object == "APC_Nod"sv) return translated_Vehicle_APC_Nod;
		if (object == "LightTank"sv) return translated_Vehicle_LightTank;
		if (object == "FlameTank"sv) return translated_Vehicle_FlameTank;
		if (object == "StealthTank"sv) return translated_Vehicle_StealthTank;
		if (object == "Chinook_Nod"sv) return translated_Vehicle_Chinook_Nod;
		if (object == "Apache"sv) return translated_Vehicle_Apache;

		if (object == "ReconBike"sv) return translated_Vehicle_ReconBike;
		if (object == "TickTank"sv) return translated_Vehicle_TickTank;

		/** GDI Vehicles */
		if (object == "Harvester_GDI"sv) return translated_Vehicle_Harvester_GDI;
		if (object == "Humvee"sv) return translated_Vehicle_Humvee;
		if (object == "MRLS"sv) return translated_Vehicle_MRLS;
		if (object == "APC_GDI"sv) return translated_Vehicle_APC_GDI;
		if (object == "MediumTank"sv) return translated_Vehicle_MediumTank;
		if (object == "MammothTank"sv) return translated_Vehicle_MammothTank;
		if (object == "Chinook_GDI"sv) return translated_Vehicle_Chinook_GDI;
		if (object == "Orca"sv) return translated_Vehicle_Orca;

		if (object == "HoverMRLS"sv) return translated_Vehicle_HoverMRLS;
		if (object == "Titan"sv) return translated_Vehicle_Titan;
		if (object == "Wolverine"sv) return translated_Vehicle_Wolverine;

		/** Other Vehicles */
		if (object == "A10_DmgType_GattlingGun"sv) return translated_Vehicle_A10_DmgType_GattlingGun;
		if (object == "A10_DmgType_Bomb"sv) return translated_Vehicle_A10_DmgType_Bomb;
		if (object == "AC130_DmgType_HeavyCannon"sv) return translated_Vehicle_AC130_DmgType_HeavyCannon;
		if (object == "AC130_DmgType_AutoCannon"sv) return translated_Vehicle_AC130_DmgType_AutoCannon;
	}
	else if (object.find("Weapon_"sv) == 0)
	{
		object.remove_prefix(7);
		if (object == "HeavyPistol"sv) return translated_Weapon_HeavyPistol;
		if (object == "Carbine"sv) return translated_Weapon_Carbine;
		if (object == "Airstrike_GDI"sv) return translated_Weapon_Airstrike_GDI;
		if (object == "Airstrike_Nod"sv) return translated_Weapon_Airstrike_Nod;
		if (object == "TiberiumFlechetteRifle"sv) return translated_Weapon_TiberiumFlechetteRifle;
		if (object == "TiberiumAutoRifle"sv) return translated_Weapon_TiberiumAutoRifle;
		if (object == "TiberiumAutoRifle_Blue"sv) return translated_Weapon_TiberiumAutoRifle_Blue;
		if (object == "EMPGrenade"sv) return translated_Weapon_EMPGrenade;
		if (object == "SmokeGrenade"sv) return translated_Weapon_SmokeGrenade;
		if (object == "TimedC4"sv) return translated_Weapon_TimedC4;
		if (object == "RemoteC4"sv) return translated_Weapon_RemoteC4;
		if (object == "ProxyC4"sv) return translated_Weapon_ProxyC4;
		if (object == "ATMine"sv) return translated_Weapon_ATMine;
		if (object == "IonCannonBeacon"sv) return translated_Weapon_IonCannonBeacon;
		if (object == "NukeBeacon"sv) return translated_Weapon_NukeBeacon;
		if (object == "DeployedC4"sv) return translated_Weapon_DeployedC4;
		if (object == "DeployedTimedC4"sv) return translated_Weapon_DeployedTimedC4;
		if (object == "DeployedRemoteC4"sv) return translated_Weapon_DeployedRemoteC4;
		if (object == "DeployedProxyC4"sv) return translated_Weapon_DeployedProxyC4;
		if (object == "DeployedATMine"sv) return translated_Weapon_DeployedATMine;
		if (object == "DeployedIonCannonBeacon"sv) return translated_Weapon_DeployedIonCannonBeacon;
		if (object == "DeployedNukeBeacon"sv) return translated_Weapon_DeployedNukeBeacon;
		if (object == "CrateNuke"sv) return translated_Weapon_CrateNuke;
	}
	else if (object.find("Projectile_"sv) == 0)
	{
		object.remove_prefix(11);
		if (object == "EMPGrenade"sv) return translated_Projectile_EMPGrenade;
		if (object == "SmokeGrenade"sv) return translated_Projectile_SmokeGrenade;
	}
	else if (object.find("InventoryManager_"sv) == 0)
	{
		object.remove_prefix(17);
		return translateCharacter(object);
	}
	else if (object.find("FamilyInfo_"sv) == 0)
	{
		object.remove_prefix(11);
		return translateCharacter(object);
	}
	else if (object.find("DmgType_"sv) == 0)
	{
		object.remove_prefix(8);

		/** Non-weapon damage types */
		if (object == "Suicided"sv) return translated_DmgType_Suicided;
		if (object == "Fell"sv) return translated_DmgType_Fell;
		if (object == "Tiberium"sv) return translated_DmgType_Tiberium;
		if (object == "TiberiumBleed"sv) return translated_DmgType_TiberiumBleed;
		if (object == "TiberiumBleed_Blue"sv) return translated_DmgType_TiberiumBleed_Blue;
		if (object == "RanOver"sv) return translated_DmgType_RanOver;

		/** Infantry weapons */
		if (object == "Pistol"sv) return translated_DmgType_Pistol;
		if (object == "SMG"sv) return translated_DmgType_SMG;
		if (object == "HeavyPistol"sv) return translated_DmgType_HeavyPistol;
		if (object == "Carbine"sv) return translated_DmgType_Carbine;
		if (object == "TiberiumFlechetteRifle"sv) return translated_DmgType_TiberiumFlechetteRifle; // Not a rifle.
		if (object == "TiberiumAutoRifle"sv) return translated_DmgType_TiberiumAutoRifle;
		if (object == "TiberiumAutoRifle_Blue"sv) return translated_DmgType_TiberiumAutoRifle_Blue;
		if (object == "TiberiumAutoRifle_Flechette_Blue"sv) return translated_DmgType_TiberiumAutoRifle_Flechette_Blue;

		if (object == "Grenade"sv) return translated_DmgType_Grenade;
		if (object == "TimedC4"sv) return translated_DmgType_TimedC4;
		if (object == "RemoteC4"sv) return translated_DmgType_RemoteC4;
		if (object == "ProxyC4"sv) return translated_DmgType_ProxyC4;
		if (object == "ATMine"sv) return translated_DmgType_ATMine;
		if (object == "EMPGrenade"sv) return translated_DmgType_EMPGrenade;
		if (object == "BurnC4"sv) return translated_DmgType_BurnC4;
		if (object == "FireBleed"sv) return translated_DmgType_FireBleed; // Caused by C4 or flame weapons

		if (object == "AutoRifle"sv) return translated_DmgType_AutoRifle;
		if (object == "Shotgun"sv) return translated_DmgType_Shotgun;
		if (object == "FlameThrower"sv) return translated_DmgType_FlameThrower;
		if (object == "GrenadeLauncher"sv) return translated_DmgType_GrenadeLauncher;
		if (object == "MarksmanRifle"sv) return translated_DmgType_MarksmanRifle;

		if (object == "ChainGun"sv) return translated_DmgType_ChainGun;
		if (object == "MissileLauncher"sv) return translated_DmgType_MissileLauncher;
		if (object == "MissileLauncher_Alt"sv) return translated_DmgType_MissileLauncher_Alt;
		if (object == "ChemicalThrower"sv) return translated_DmgType_ChemicalThrower;
		if (object == "LaserRifle"sv) return translated_DmgType_LaserRifle;
		if (object == "TacticalRifle"sv) return translated_DmgType_TacticalRifle;
		if (object == "RocketLauncher"sv) return translated_DmgType_RocketLauncher;
		if (object == "LaserChainGun"sv) return translated_DmgType_LaserChainGun;
		if (object == "FlakCannon"sv) return translated_DmgType_FlakCannon;
		if (object == "FlakCannon_Alt"sv) return translated_DmgType_FlakCannon_Alt;
		if (object == "SniperRifle"sv) return translated_DmgType_SniperRifle;
		if (object == "RamjetRifle"sv) return translated_DmgType_RamjetRifle;
		if (object == "Railgun"sv) return translated_DmgType_Railgun;
		if (object == "PersonalIonCannon"sv) return translated_DmgType_PersonalIonCannon;
		if (object == "VoltRifle"sv) return translated_DmgType_VoltRifle;
		if (object == "VoltRifle_Alt"sv) return translated_DmgType_VoltRifle_Alt;
		if (object == "VoltAutoRifle"sv) return translated_DmgType_VoltAutoRifle;
		if (object == "VoltAutoRifle_Alt"sv) return translated_DmgType_VoltAutoRifle_Alt;

		/** Vehicle weapons */
		if (object == "MammothTank_Missile"sv) return translated_DmgType_MammothTank_Missile;
		if (object == "MammothTank_Cannon"sv) return translated_DmgType_MammothTank_Cannon;
		if (object == "Orca_Missile"sv) return translated_DmgType_Orca_Missile;
		if (object == "Orca_Gun"sv) return translated_DmgType_Orca_Gun;
		if (object == "Orca_Passenger"sv) return translated_DmgType_Orca_Passenger;
		if (object == "Apache_Rocket"sv) return translated_DmgType_Apache_Rocket;
		if (object == "Apache_Gun"sv) return translated_DmgType_Apache_Gun;
		if (object == "Apache_Passenger"sv) return translated_DmgType_Apache_Passenger;

		/** Base Defence Weapons */
		if (object == "AGT_MG"sv) return translated_DmgType_AGT_MG;
		if (object == "AGT_Rocket"sv) return translated_DmgType_AGT_Rocket;
		if (object == "Obelisk"sv) return translated_DmgType_Obelisk;

		/** Defence Structure Weapons */
		if (object == "AGT_MG"sv) return translated_DmgType_AGT_MG;
		if (object == "AGT_Rocket"sv) return translated_DmgType_AGT_Rocket;
		if (object == "Obelisk"sv) return translated_DmgType_Obelisk;
		if (object == "GuardTower"sv) return translated_DmgType_GuardTower;
		if (object == "Turret"sv) return translated_DmgType_Turret;
		if (object == "SAMSite"sv) return translated_DmgType_SAMSite;
		if (object == "AATower"sv) return translated_DmgType_AATower;
		if (object == "GunEmpl"sv) return translated_DmgType_GunEmpl;
		if (object == "GunEmpl_Alt"sv) return translated_DmgType_GunEmpl_Alt;
		if (object == "RocketEmpl_Swarm"sv) return translated_DmgType_RocketEmpl_Swarm;
		if (object == "RocketEmpl_Missile"sv) return translated_DmgType_RocketEmpl_Missile;

		/** Other Weapons */
		if (object == "Nuke"sv) return translated_DmgType_Nuke;
		if (object == "IonCannon"sv) return translated_DmgType_IonCannon;

		/** Nod Vehicles */
		if (object == "Harvester_Nod"sv) return translated_DmgType_Harvester_Nod;
		if (object == "Buggy"sv) return translated_DmgType_Buggy;
		if (object == "Artillery"sv) return translated_DmgType_Artillery;
		if (object == "APC_Nod"sv) return translated_DmgType_APC_Nod;
		if (object == "LightTank"sv) return translated_DmgType_LightTank;
		if (object == "FlameTank"sv) return translated_DmgType_FlameTank;
		if (object == "StealthTank"sv) return translated_DmgType_StealthTank;
		if (object == "Chinook_Nod"sv) return translated_DmgType_Chinook_Nod;
		if (object == "Apache"sv) return translated_DmgType_Apache;

		/** GDI Vehicles */
		if (object == "Harvester_GDI"sv) return translated_DmgType_Harvester_GDI;
		if (object == "Humvee"sv) return translated_DmgType_Humvee;
		if (object == "MRLS"sv) return translated_DmgType_MRLS;
		if (object == "APC_GDI"sv) return translated_DmgType_APC_GDI;
		if (object == "MediumTank"sv) return translated_DmgType_MediumTank;
		if (object == "MammothTank"sv) return translated_DmgType_MammothTank;
		if (object == "Chinook_GDI"sv) return translated_DmgType_Chinook_GDI;
		if (object == "Orca"sv) return translated_DmgType_Orca;

		/** Other Vehicles */
		if (object == "A10_Missile"sv) return translated_DmgType_A10_Missile;
	}
	else if (object.find("Building_"sv) == 0)
	{
		object.remove_prefix(9);
		/** Nod structures */
		if (object == "HandOfNod"sv) return translated_Building_HandOfNod;
		if (object == "AirTower"sv) return translated_Building_AirTower;
		if (object == "Airstrip"sv) return translated_Building_Airstrip;
		if (object == "Refinery_Nod"sv) return translated_Building_Refinery_Nod;
		if (object == "PowerPlant_Nod"sv) return translated_Building_PowerPlant_Nod;
		if (object == "HandOfNod_Internals"sv) return translated_Building_HandOfNod_Internals;
		if (object == "AirTower_Internals"sv) return translated_Building_AirTower_Internals;
		if (object == "Airstrip_Internals"sv) return translated_Building_Airstrip_Internals;
		if (object == "Refinery_Nod_Internals"sv) return translated_Building_Refinery_Nod_Internals;
		if (object == "PowerPlant_Nod_Internals"sv) return translated_Building_PowerPlant_Nod_Internals;
		
		/** GDI structures */
		if (object == "Barracks"sv) return translated_Building_Barracks;
		if (object == "WeaponsFactory"sv) return translated_Building_WeaponsFactory;
		if (object == "Refinery_GDI"sv) return translated_Building_Refinery_GDI;
		if (object == "PowerPlant_GDI"sv) return translated_Building_PowerPlant_GDI;
		if (object == "Barracks_Internals"sv) return translated_Building_Barracks_Internals;
		if (object == "WeaponsFactory_Internals"sv) return translated_Building_WeaponsFactory_Internals;
		if (object == "Refinery_GDI_Internals"sv) return translated_Building_Refinery_GDI_Internals;
		if (object == "PowerPlant_GDI_Internals"sv) return translated_Building_PowerPlant_GDI_Internals;

		/** Defense structures */
		if (object == "AdvancedGuardTower"sv) return translated_Building_AdvancedGuardTower;
		if (object == "Obelisk"sv) return translated_Building_Obelisk;
		if (object == "AdvancedGuardTower_Internals"sv) return translated_Building_AdvancedGuardTower_Internals;
		if (object == "Obelisk_Internals"sv) return translated_Building_Obelisk_Internals;

		/** Other structures */
		if (object == "Silo"sv) return translated_Building_Silo;
		if (object == "CommCentre"sv) return translated_Building_CommCentre;
		if (object == "Silo_Internals"sv) return translated_Building_Silo_Internals;
		if (object == "CommCentre_Internals"sv) return translated_Building_CommCentre_Internals;
	}
	else if (object.find("CapturableMCT_"sv) == 0)
	{
		object.remove_prefix(14);
		if (object == "Fort"sv) return translated_CapturableMCT_Fort;
		if (object == "MC"sv) return translated_CapturableMCT_MC;
		if (object == "Fort_Internals"sv) return translated_CapturableMCT_Fort_Internals;
		if (object == "MC_Internals"sv) return translated_CapturableMCT_MC_Internals;
	}
	else if (object.find("Defence_"sv) == 0)
	{
		object.remove_prefix(8);
		if (object == "GuardTower"sv) return translated_Defence_GuardTower;
		if (object == "Turret"sv) return translated_Defence_Turret;
		if (object == "SAMSite"sv) return translated_Defence_SAMSite;
		if (object == "AATower"sv) return translated_Defence_AATower;
		if (object == "GunEmplacement"sv) return translated_Defence_GunEmplacement;
		if (object == "RocketEmplacement"sv) return translated_Defence_RocketEmplacement;
	}
	else if (object.find("Sentinel_"sv) == 0)
	{
		object.remove_prefix(9);
		if (object == "AGT_MG_Base"sv) return translated_Sentinel_AGT_MG_Base;
		if (object == "AGT_Rockets_Base"sv) return translated_Sentinel_AGT_Rockets_Base;
		if (object == "Obelisk_Laser_Base"sv) return translated_Sentinel_Obelisk_Laser_Base;
	}
	else if (object.find("UTDmgType_"sv) == 0)
	{
		object.remove_prefix(10);
		if (object == "VehicleExplosion"sv) return translated_UTDmgType_VehicleExplosion;
		if (object == "Drowned"sv) return translated_UTDmgType_Drowned;
	}
	else if (object.find("VoteMenuChoice_"sv) == 0)
	{
		object.remove_prefix(15);
		if (object == "AddBots"sv) return translated_VoteMenuChoice_AddBots;
		if (object == "ChangeMap"sv) return translated_VoteMenuChoice_ChangeMap;
		if (object == "Donate"sv) return translated_VoteMenuChoice_Donate;
		if (object == "Kick"sv) return translated_VoteMenuChoice_Kick;
		if (object == "RemoveBots"sv) return translated_VoteMenuChoice_RemoveBots;
		if (object == "RestartMatch"sv) return translated_VoteMenuChoice_RestartMatch;
		if (object == "StartMatch"sv) return translated_VoteMenuChoice_StartMatch;
		if (object == "Survey"sv) return translated_VoteMenuChoice_Survey;
	}
	else if (object == "IonCannonBeacon"sv) return translated_IonCannonBeacon;
	else if (object == "NukeBeacon"sv) return translated_NukeBeacon;
	else if (object == "KillZDamageType"sv) return translated_KillZDamageType;
	return translateCharacter(object);
}